

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::anon_unknown_8::SetStringVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  pointer pcVar4;
  Descriptor *descriptor_00;
  string *psVar5;
  FileOptions_OptimizeMode FVar6;
  mapped_type *pmVar7;
  long lVar8;
  long *plVar9;
  undefined8 *puVar10;
  Options *in_RCX;
  long *plVar11;
  size_type *psVar12;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  char *pcVar13;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  key_type local_110;
  undefined1 local_f0 [8];
  string default_variable_string;
  key_type local_c0;
  key_type local_a0;
  Options *local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  SetCommonFieldVariables(descriptor,variables,options);
  local_80 = options;
  DefaultValue_abi_cxx11_
            ((string *)local_f0,(cpp *)options,(Options *)descriptor,(FieldDescriptor *)in_RCX);
  psVar1 = &__str._M_string_length;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"default","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_58);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_f0);
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if (local_f0 != (undefined1  [8])&default_variable_string._M_string_length) {
    operator_delete((void *)local_f0);
  }
  psVar12 = &default_variable_string._M_string_length;
  local_f0 = (undefined1  [8])psVar12;
  lVar8 = google::protobuf::FastUInt64ToBufferLeft
                    (*(ulong *)(*(long *)(descriptor + 0x90) + 8),(char *)psVar12);
  default_variable_string._M_dataplus._M_p = (pointer)(lVar8 - (long)psVar12);
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,local_f0,default_variable_string._M_dataplus._M_p + (long)local_f0);
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"default_length","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_58);
  field = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p);
    field = extraout_RDX_00;
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
    field = extraout_RDX_01;
  }
  MakeDefaultName_abi_cxx11_((string *)local_f0,(cpp *)descriptor,field);
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"default_variable_name","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_58);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  lVar8 = *(long *)(*(long *)(descriptor + 0x90) + 8);
  __str.field_2._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)*(long *)(descriptor + 0x90) >> 8),lVar8 == 0);
  if (lVar8 == 0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"proto_ns","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&local_a0,"&::",pmVar7);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
  }
  else {
    QualifiedClassName_abi_cxx11_
              (&local_150,*(cpp **)(descriptor + 0x50),(Descriptor *)local_80,in_RCX);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x295a29);
    local_130 = &local_120;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_120 = *plVar11;
      lStack_118 = plVar9[3];
    }
    else {
      local_120 = *plVar11;
      local_130 = (long *)*plVar9;
    }
    local_128 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_c0.field_2._M_allocated_capacity = *psVar12;
      local_c0.field_2._8_8_ = plVar9[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar12;
      local_c0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_c0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_f0);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_a0.field_2._M_allocated_capacity = *psVar12;
      local_a0.field_2._8_8_ = plVar9[3];
      local_a0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar12;
      local_a0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_a0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
  }
  psVar12 = puVar10 + 2;
  if ((size_type *)*puVar10 == psVar12) {
    __str._M_string_length = *psVar12;
    __str.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar10 + 3);
    __str.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
    local_58 = (undefined1  [8])psVar1;
  }
  else {
    __str._M_string_length = *psVar12;
    local_58 = (undefined1  [8])*puVar10;
  }
  __str._M_dataplus._M_p = (pointer)puVar10[1];
  *puVar10 = psVar12;
  __str.field_2._M_local_buf[0xf] = lVar8 != 0;
  puVar10[1] = 0;
  *(undefined1 *)psVar12 = 0;
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"default_variable","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_78);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_58);
  if ((FieldDescriptor *)local_78._0_8_ != (FieldDescriptor *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if (lVar8 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    psVar5 = &local_c0;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    psVar5 = &local_150;
  }
  puVar3 = (undefined1 *)(&(psVar5->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 != &psVar5->field_2) {
    operator_delete(puVar3);
  }
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_58 = (undefined1  [8])google::protobuf::FieldDescriptor::TypeOnceInit;
    local_78._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)local_58,
               (FieldDescriptor **)local_78);
  }
  pcVar13 = "char";
  if (*(int *)(descriptor + 0x38) == 0xc) {
    pcVar13 = "void";
  }
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"pointer_type","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_58);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar13);
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"DCHK","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_78);
  pcVar4 = (pmVar7->_M_dataplus)._M_p;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar4,pcVar4 + pmVar7->_M_string_length);
  std::__cxx11::string::append(local_58);
  paVar2 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"null_check","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  descriptor_00 = *(Descriptor **)(descriptor + 0x50);
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"release_","");
  SafeFunctionName((string *)local_58,descriptor_00,descriptor,(string *)local_78);
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"release_name","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"full_name","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_58);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if (local_80->opensource_runtime == true) {
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"string_piece","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_58);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x2a2075);
  }
  else {
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"string_piece","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_58);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x294066);
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  FVar6 = GetOptimizeFor(*(FileDescriptor **)(descriptor + 0x28),local_80,(bool *)0x0);
  pcVar13 = "";
  if (FVar6 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    pcVar13 = "Lite";
  }
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"lite","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_58);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar13);
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58);
  }
  if (local_f0 != (undefined1  [8])&default_variable_string._M_string_length) {
    operator_delete((void *)local_f0);
  }
  return;
}

Assistant:

void SetStringVariables(const FieldDescriptor* descriptor,
                        std::map<std::string, std::string>* variables,
                        const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["default"] = DefaultValue(options, descriptor);
  (*variables)["default_length"] =
      StrCat(descriptor->default_value_string().length());
  std::string default_variable_string = MakeDefaultName(descriptor);
  (*variables)["default_variable_name"] = default_variable_string;
  (*variables)["default_variable"] =
      descriptor->default_value_string().empty()
          ? "&::" + (*variables)["proto_ns"] +
                "::internal::GetEmptyStringAlreadyInited()"
          : "&" + QualifiedClassName(descriptor->containing_type(), options) +
                "::" + default_variable_string + ".get()";
  (*variables)["pointer_type"] =
      descriptor->type() == FieldDescriptor::TYPE_BYTES ? "void" : "char";
  (*variables)["null_check"] = (*variables)["DCHK"] + "(value != nullptr);\n";
  // NOTE: Escaped here to unblock proto1->proto2 migration.
  // TODO(liujisi): Extend this to apply for other conflicting methods.
  (*variables)["release_name"] =
      SafeFunctionName(descriptor->containing_type(), descriptor, "release_");
  (*variables)["full_name"] = descriptor->full_name();

  if (options.opensource_runtime) {
    (*variables)["string_piece"] = "::std::string";
  } else {
    (*variables)["string_piece"] = "::StringPiece";
  }

  (*variables)["lite"] =
      HasDescriptorMethods(descriptor->file(), options) ? "" : "Lite";
}